

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_getrusage(uv_rusage_t *rusage)

{
  int iVar1;
  int *piVar2;
  undefined1 local_a8 [8];
  rusage usage;
  uv_rusage_t *rusage_local;
  
  usage.field_15 = (anon_union_8_2_1ea8062a_for_rusage_28)rusage;
  iVar1 = getrusage(RUSAGE_SELF,(rusage *)local_a8);
  if (iVar1 == 0) {
    *(undefined1 (*) [8])usage.field_15 = local_a8;
    *(__time_t *)(usage.field_15.ru_nivcsw + 8) = usage.ru_utime.tv_sec;
    *(__suseconds_t *)(usage.field_15.ru_nivcsw + 0x10) = usage.ru_utime.tv_usec;
    *(__time_t *)(usage.field_15.ru_nivcsw + 0x18) = usage.ru_stime.tv_sec;
    *(__suseconds_t *)(usage.field_15.ru_nivcsw + 0x20) = usage.ru_stime.tv_usec;
    *(anon_union_8_2_32a8cd6e_for_rusage_2 *)(usage.field_15.ru_nivcsw + 0x28) = usage.field_2;
    *(anon_union_8_2_5528cae4_for_rusage_4 *)(usage.field_15.ru_nivcsw + 0x30) = usage.field_3;
    *(anon_union_8_2_3f62dd0c_for_rusage_6 *)(usage.field_15.ru_nivcsw + 0x38) = usage.field_4;
    *(anon_union_8_2_8fb74f6e_for_rusage_8 *)(usage.field_15.ru_nivcsw + 0x40) = usage.field_5;
    *(anon_union_8_2_b9e4c7ca_for_rusage_10 *)(usage.field_15.ru_nivcsw + 0x48) = usage.field_6;
    *(anon_union_8_2_4126dfc2_for_rusage_12 *)(usage.field_15.ru_nivcsw + 0x50) = usage.field_7;
    *(anon_union_8_2_7143a4e0_for_rusage_14 *)(usage.field_15.ru_nivcsw + 0x58) = usage.field_8;
    *(anon_union_8_2_0b88892e_for_rusage_16 *)(usage.field_15.ru_nivcsw + 0x60) = usage.field_9;
    *(anon_union_8_2_21cd85ac_for_rusage_18 *)(usage.field_15.ru_nivcsw + 0x68) = usage.field_10;
    *(anon_union_8_2_e633e1a2_for_rusage_20 *)(usage.field_15.ru_nivcsw + 0x70) = usage.field_11;
    *(anon_union_8_2_9372aa9a_for_rusage_22 *)(usage.field_15.ru_nivcsw + 0x78) = usage.field_12;
    *(anon_union_8_2_24e7180c_for_rusage_24 *)(usage.field_15.ru_nivcsw + 0x80) = usage.field_13;
    *(anon_union_8_2_78e926dc_for_rusage_26 *)(usage.field_15.ru_nivcsw + 0x88) = usage.field_14;
    rusage_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    rusage_local._4_4_ = -*piVar2;
  }
  return rusage_local._4_4_;
}

Assistant:

int uv_getrusage(uv_rusage_t* rusage) {
  struct rusage usage;

  if (getrusage(RUSAGE_SELF, &usage))
    return -errno;

  rusage->ru_utime.tv_sec = usage.ru_utime.tv_sec;
  rusage->ru_utime.tv_usec = usage.ru_utime.tv_usec;

  rusage->ru_stime.tv_sec = usage.ru_stime.tv_sec;
  rusage->ru_stime.tv_usec = usage.ru_stime.tv_usec;

#if !defined(__MVS__)
  rusage->ru_maxrss = usage.ru_maxrss;
  rusage->ru_ixrss = usage.ru_ixrss;
  rusage->ru_idrss = usage.ru_idrss;
  rusage->ru_isrss = usage.ru_isrss;
  rusage->ru_minflt = usage.ru_minflt;
  rusage->ru_majflt = usage.ru_majflt;
  rusage->ru_nswap = usage.ru_nswap;
  rusage->ru_inblock = usage.ru_inblock;
  rusage->ru_oublock = usage.ru_oublock;
  rusage->ru_msgsnd = usage.ru_msgsnd;
  rusage->ru_msgrcv = usage.ru_msgrcv;
  rusage->ru_nsignals = usage.ru_nsignals;
  rusage->ru_nvcsw = usage.ru_nvcsw;
  rusage->ru_nivcsw = usage.ru_nivcsw;
#endif

  return 0;
}